

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O3

int motion_field_projection(AV1_COMMON *cm,MV_REFERENCE_FRAME start_frame,int dir)

{
  short sVar1;
  int iVar2;
  TPL_MV_REF *pTVar3;
  RefCntBuffer *pRVar4;
  SequenceHeader *pSVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  MV_REFERENCE_FRAME *pMVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint local_58 [10];
  int base_blk_row;
  int ref_offset [8];
  
  pTVar3 = cm->tpl_mvs;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  iVar6 = 0;
  iVar8 = 0;
  if (((((byte)(start_frame - 1U) < 8) &&
       (iVar8 = 0, (long)cm->remapped_ref_idx[(byte)start_frame - 1] != -1)) &&
      (pRVar4 = cm->ref_frame_map[cm->remapped_ref_idx[(byte)start_frame - 1]], iVar8 = iVar6,
      pRVar4 != (RefCntBuffer *)0x0)) &&
     ((((pRVar4->frame_type & 0xfd) != 0 &&
       (iVar6 = pRVar4->mi_rows, iVar6 == (cm->mi_params).mi_rows)) &&
      (iVar2 = pRVar4->mi_cols, iVar2 == (cm->mi_params).mi_cols)))) {
    uVar13 = pRVar4->order_hint;
    pSVar5 = cm->seq_params;
    iVar8 = (pSVar5->order_hint_info).enable_order_hint;
    if (iVar8 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = uVar13 - cm->cur_frame->order_hint;
      uVar18 = 1 << ((byte)(pSVar5->order_hint_info).order_hint_bits_minus_1 & 0x1f);
      uVar12 = (uVar18 - 1 & uVar12) - (uVar18 & uVar12);
    }
    lVar19 = 0;
    do {
      uVar18 = 0;
      if (iVar8 != 0) {
        uVar18 = uVar13 - pRVar4->ref_order_hints[lVar19];
        uVar21 = 1 << ((byte)(pSVar5->order_hint_info).order_hint_bits_minus_1 & 0x1f);
        uVar18 = (uVar21 - 1 & uVar18) - (uVar21 & uVar18);
      }
      local_58[lVar19 + 1] = uVar18;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 7);
    uVar13 = iVar6 + 1 >> 1;
    iVar8 = 1;
    if (0 < (int)uVar13) {
      uVar21 = iVar2 + 1 >> 1;
      uVar18 = uVar12;
      if ((int)uVar12 < 1) {
        uVar18 = -uVar12;
      }
      uVar7 = -uVar12;
      if (dir != 2) {
        uVar7 = uVar12;
      }
      uVar12 = 0xffffffe1;
      if (-0x1f < (int)uVar7) {
        uVar12 = uVar7;
      }
      uVar15 = 0x1f;
      if (uVar7 < 0x1f) {
        uVar15 = uVar7;
      }
      if ((int)uVar7 < 1) {
        uVar15 = uVar12;
      }
      pMVar11 = &pRVar4->mvs->ref_frame;
      uVar20 = 0;
      do {
        if (0 < (int)uVar21) {
          uVar12 = (uint)uVar20;
          uVar16 = 0;
          do {
            if (((0 < (long)pMVar11[uVar16 * 8]) &&
                (uVar7 = local_58[pMVar11[uVar16 * 8]], 0 < (int)uVar7)) &&
               ((uVar7 < 0x20 && (uVar18 < 0x20)))) {
              uVar14 = 0x1f;
              if (uVar7 < 0x1f) {
                uVar14 = (ulong)uVar7;
              }
              iVar8 = (int)*(short *)(pMVar11 + uVar16 * 8 + -4) * div_mult[uVar14] * uVar15;
              if (iVar8 < 0) {
                uVar9 = -(0x2000U - iVar8 >> 0xe);
              }
              else {
                uVar9 = iVar8 + 0x2000U >> 0xe;
              }
              sVar1 = *(short *)(pMVar11 + uVar16 * 8 + -2);
              iVar8 = div_mult[uVar14] * uVar15 * (int)sVar1;
              if (iVar8 < 0) {
                uVar22 = -(0x2000U - iVar8 >> 0xe);
              }
              else {
                uVar22 = iVar8 + 0x2000U >> 0xe;
              }
              uVar14 = (ulong)uVar9;
              if (0x3ffe < (int)uVar9) {
                uVar14 = 0x3fff;
              }
              if ((int)uVar14 < -0x3ffe) {
                uVar14 = 0xffffc001;
              }
              uVar17 = (ulong)uVar22;
              if (0x3ffe < (int)uVar22) {
                uVar17 = 0x3fff;
              }
              if ((int)uVar17 < -0x3ffe) {
                uVar17 = 0xffffc001;
              }
              iVar8 = -((uint)-(int)uVar14 >> 6);
              if (-1 < (int)uVar9) {
                iVar8 = (int)(uVar14 >> 6);
              }
              iVar6 = -((uint)-(int)uVar17 >> 6);
              if (-1 < (int)uVar22) {
                iVar6 = (int)(uVar17 >> 6);
              }
              iVar10 = -iVar6;
              iVar2 = -iVar8;
              if ((dir & 0xfffffffeU) != 2) {
                iVar10 = iVar6;
                iVar2 = iVar8;
              }
              iVar8 = iVar2 + uVar12;
              if ((-1 < iVar8) && (iVar8 < (cm->mi_params).mi_rows >> 1)) {
                uVar9 = (uint)uVar16;
                uVar22 = uVar9 + iVar10;
                if ((-1 < (int)uVar22) &&
                   (((((int)uVar22 < (cm->mi_params).mi_cols >> 1 &&
                      ((int)(uVar12 & 0x7ffffff8) <= iVar8)) &&
                     (iVar8 < (int)((uVar12 & 0x7ffffff8) + 8))) &&
                    (((int)((uVar9 & 0x7ffffff8) - 8) <= (int)uVar22 &&
                     (uVar22 < (uVar9 & 0x7ffffff8) + 0x10)))))) {
                  iVar8 = iVar10 + uVar9 + (iVar2 + uVar12) * ((cm->mi_params).mi_stride >> 1);
                  pTVar3[iVar8].mfmv0.as_mv.row = *(short *)(pMVar11 + uVar16 * 8 + -4);
                  pTVar3[iVar8].mfmv0.as_mv.col = sVar1;
                  pTVar3[iVar8].ref_frame_offset = (uint8_t)uVar7;
                }
              }
            }
            uVar16 = uVar16 + 1;
          } while (uVar21 != uVar16);
        }
        uVar20 = uVar20 + 1;
        pMVar11 = pMVar11 + (ulong)uVar21 * 8;
      } while (uVar20 != uVar13);
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

static int motion_field_projection(AV1_COMMON *cm,
                                   MV_REFERENCE_FRAME start_frame, int dir) {
  TPL_MV_REF *tpl_mvs_base = cm->tpl_mvs;
  int ref_offset[REF_FRAMES] = { 0 };

  const RefCntBuffer *const start_frame_buf =
      get_ref_frame_buf(cm, start_frame);
  if (start_frame_buf == NULL) return 0;

  if (start_frame_buf->frame_type == KEY_FRAME ||
      start_frame_buf->frame_type == INTRA_ONLY_FRAME)
    return 0;

  if (start_frame_buf->mi_rows != cm->mi_params.mi_rows ||
      start_frame_buf->mi_cols != cm->mi_params.mi_cols)
    return 0;

  const int start_frame_order_hint = start_frame_buf->order_hint;
  const unsigned int *const ref_order_hints =
      &start_frame_buf->ref_order_hints[0];
  const int cur_order_hint = cm->cur_frame->order_hint;
  int start_to_current_frame_offset = get_relative_dist(
      &cm->seq_params->order_hint_info, start_frame_order_hint, cur_order_hint);

  for (MV_REFERENCE_FRAME rf = LAST_FRAME; rf <= INTER_REFS_PER_FRAME; ++rf) {
    ref_offset[rf] = get_relative_dist(&cm->seq_params->order_hint_info,
                                       start_frame_order_hint,
                                       ref_order_hints[rf - LAST_FRAME]);
  }

  if (dir == 2) start_to_current_frame_offset = -start_to_current_frame_offset;

  MV_REF *mv_ref_base = start_frame_buf->mvs;
  const int mvs_rows = (cm->mi_params.mi_rows + 1) >> 1;
  const int mvs_cols = (cm->mi_params.mi_cols + 1) >> 1;

  for (int blk_row = 0; blk_row < mvs_rows; ++blk_row) {
    for (int blk_col = 0; blk_col < mvs_cols; ++blk_col) {
      MV_REF *mv_ref = &mv_ref_base[blk_row * mvs_cols + blk_col];
      MV fwd_mv = mv_ref->mv.as_mv;

      if (mv_ref->ref_frame > INTRA_FRAME) {
        int_mv this_mv;
        int mi_r, mi_c;
        const int ref_frame_offset = ref_offset[mv_ref->ref_frame];

        int pos_valid =
            abs(ref_frame_offset) <= MAX_FRAME_DISTANCE &&
            ref_frame_offset > 0 &&
            abs(start_to_current_frame_offset) <= MAX_FRAME_DISTANCE;

        if (pos_valid) {
          get_mv_projection(&this_mv.as_mv, fwd_mv,
                            start_to_current_frame_offset, ref_frame_offset);
          pos_valid = get_block_position(cm, &mi_r, &mi_c, blk_row, blk_col,
                                         this_mv.as_mv, dir >> 1);
        }

        if (pos_valid) {
          const int mi_offset = mi_r * (cm->mi_params.mi_stride >> 1) + mi_c;

          tpl_mvs_base[mi_offset].mfmv0.as_mv.row = fwd_mv.row;
          tpl_mvs_base[mi_offset].mfmv0.as_mv.col = fwd_mv.col;
          tpl_mvs_base[mi_offset].ref_frame_offset = ref_frame_offset;
        }
      }
    }
  }

  return 1;
}